

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O2

Vec_Ptr_t * Gia_GetFakeNames(int nNames)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  char *pcVar3;
  void **__ptr;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char local_39;
  char local_38;
  char local_37 [3];
  uint local_34;
  
  pVVar2 = Vec_PtrAlloc(nNames);
  uVar6 = 0;
  local_34 = 0;
  uVar5 = local_34;
  if (0 < nNames) {
    local_34 = nNames;
    uVar5 = nNames;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    if (nNames < 0x1a) {
      local_39 = (char)uVar6 + 'a';
      pcVar3 = &local_38;
    }
    else {
      local_39 = (char)((ulong)uVar6 / 0x1a) * -0x1a + 'a' + (char)uVar6;
      local_38 = (char)((ulong)uVar6 / 0x1a) + '0';
      pcVar3 = local_37;
    }
    *pcVar3 = '\0';
    pcVar3 = Extra_UtilStrsav(&local_39);
    iVar1 = pVVar2->nSize;
    if (iVar1 == pVVar2->nCap) {
      uVar4 = iVar1 * 2;
      if (iVar1 < 0x10) {
        uVar4 = 0x10;
      }
      __ptr = pVVar2->pArray;
      uVar5 = local_34;
      if (iVar1 < (int)uVar4) {
        if (__ptr == (void **)0x0) {
          __ptr = (void **)malloc((ulong)uVar4 << 3);
        }
        else {
          __ptr = (void **)realloc(__ptr,(ulong)uVar4 << 3);
        }
        pVVar2->pArray = __ptr;
        pVVar2->nCap = uVar4;
        uVar5 = local_34;
      }
    }
    else {
      __ptr = pVVar2->pArray;
    }
    pVVar2->nSize = iVar1 + 1;
    __ptr[iVar1] = pcVar3;
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Gia_GetFakeNames( int nNames )
{
    Vec_Ptr_t * vNames;
    char Buffer[5];
    int i;

    vNames = Vec_PtrAlloc( nNames );
    for ( i = 0; i < nNames; i++ )
    {
        if ( nNames < 26 )
        {
            Buffer[0] = 'a' + i;
            Buffer[1] = 0;
        }
        else
        {
            Buffer[0] = 'a' + i%26;
            Buffer[1] = '0' + i/26;
            Buffer[2] = 0;
        }
        Vec_PtrPush( vNames, Extra_UtilStrsav(Buffer) );
    }
    return vNames;
}